

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Var * __thiscall wabt::Var::operator=(Var *this,Var *rhs)

{
  string_view name;
  bool bVar1;
  Var *rhs_local;
  Var *this_local;
  
  (this->loc).filename._M_len = (rhs->loc).filename._M_len;
  (this->loc).filename._M_str = (rhs->loc).filename._M_str;
  (this->loc).field_1.field_1.offset = (rhs->loc).field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = *(undefined8 *)((long)&(rhs->loc).field_1 + 8);
  bVar1 = is_index(rhs);
  if (bVar1) {
    set_index(this,(rhs->field_2).index_);
  }
  else {
    name = (string_view)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)&(rhs->field_2).name_)
    ;
    set_name(this,name);
  }
  return this;
}

Assistant:

Var& Var::operator=(const Var& rhs) {
  loc = rhs.loc;
  if (rhs.is_index()) {
    set_index(rhs.index_);
  } else {
    set_name(rhs.name_);
  }
  return *this;
}